

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

int Session_destroy(Session_t *handle)

{
  ostream *poVar1;
  ShPtr<HG::SessionImpl> shptr;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Calling destroy for session @");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,'\n');
  shptr.cblock = (ShPtrRep *)handle;
  ShPtr<HG::SessionImpl>::~ShPtr(&shptr);
  return 0;
}

Assistant:

int Session_destroy(Session_t *handle) {
    std::cout << "Calling destroy for session @" << handle << '\n';
    auto rep = HgHandles::repr(handle, HgHandles::RefCount());
    ShPtr<HG::SessionImpl> shptr(rep);
    return 0;
}